

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6526Storage.hpp
# Opt level: O0

void __thiscall MOS::MOS6526::TODStorage<true>::write<0>(TODStorage<true> *this,uint8_t v)

{
  uint32_t mask;
  int shift;
  uint8_t v_local;
  TODStorage<true> *this_local;
  
  if (((this->super_TODBase).write_alarm & 1U) == 0) {
    this->value_ = this->value_ & 0xffffff00 | (uint)v;
    this->increment_mask_ = 0xffffffff;
  }
  else {
    this->alarm_ = this->alarm_ & 0xffffff00 | (uint)v;
  }
  return;
}

Assistant:

void write(uint8_t v) {
			if constexpr (byte == 3) {
				return;
			}
			constexpr int shift = byte << 3;

			// Write to either the alarm or the current value as directed;
			// writing to any part of the current value other than the LSB
			// pauses incrementing until the LSB is written.
			const uint32_t mask = uint32_t(~(0xff << shift));
			if(write_alarm) {
				alarm_ = (alarm_ & mask) | uint32_t(v << shift);
			} else {
				value_ = (value_ & mask) | uint32_t(v << shift);
				increment_mask_ = (byte == 0) ? uint32_t(~0) : 0;
			}
		}